

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>::~PromiseDataBase
          (PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }